

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.h
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addSupportedCapabilitiesToSet<spv_operand_desc_t>
          (TrimCapabilitiesPass *this,spv_operand_desc_t *descriptor,CapabilitySet *output)

{
  bool bVar1;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  Capability local_2c;
  Capability local_28;
  Capability capability;
  uint32_t i;
  uint32_t capabilityCount;
  CapabilitySet *output_local;
  spv_operand_desc_t *descriptor_local;
  TrimCapabilitiesPass *this_local;
  
  capability = descriptor->numCapabilities;
  _i = output;
  output_local = (CapabilitySet *)descriptor;
  descriptor_local = (spv_operand_desc_t *)this;
  for (local_28 = CapabilityMatrix; local_28 < capability; local_28 = local_28 + CapabilityShader) {
    local_2c = *(Capability *)
                ((long)&(output_local[1].buckets_.
                         super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data + (ulong)local_28 * 4);
    bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_2c);
    if (bVar1) {
      EnumSet<spv::Capability>::insert(&local_50,_i,&local_2c);
    }
  }
  return;
}

Assistant:

inline void addSupportedCapabilitiesToSet(const Descriptor* const descriptor,
                                            CapabilitySet* output) const {
    const uint32_t capabilityCount = descriptor->numCapabilities;
    for (uint32_t i = 0; i < capabilityCount; ++i) {
      const auto capability = descriptor->capabilities[i];
      if (supportedCapabilities_.contains(capability)) {
        output->insert(capability);
      }
    }
  }